

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

void __thiscall RuntimeObjectSystem::AddPathToSourceSearch(RuntimeObjectSystem *this,char *path)

{
  char *pcVar1;
  mapped_type *pmVar2;
  allocator<char> local_49;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_48 = (undefined1  [8])&PTR__Path_001198d8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_49);
  pmVar2 = std::
           map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
           ::operator[](&this->m_FoundSourceDirectoryMappings,(key_type *)local_48);
  pcVar1 = (char *)(pmVar2->m_string)._M_string_length;
  strlen(path);
  std::__cxx11::string::_M_replace((ulong)&pmVar2->m_string,0,pcVar1,(ulong)path);
  local_48 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RuntimeObjectSystem::AddPathToSourceSearch( const char* path )
{
    m_FoundSourceDirectoryMappings[ path ] = path;
}